

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::relax(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  ulong uVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  longlong local_120;
  undefined1 local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  uint local_108 [23];
  undefined3 uStack_ab;
  undefined5 uStack_a8;
  undefined8 local_a0;
  cpp_dec_float<200U,_int,_void> local_90;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_118,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar1 = -(ulong)(*(Real *)((long)local_118 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_90,
             (double)(~uVar1 & (ulong)(*(Real *)((long)local_118 + 0x40) * 1e-05) |
                     uVar1 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
  local_118 = (undefined1  [8])0x3fee666666666666;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&(this->minStab).m_backend,(double *)local_118);
  local_a0._0_4_ = cpp_dec_float_finite;
  local_a0._4_4_ = 0x1c;
  local_118 = (undefined1  [8])0x0;
  _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[0x14] = 0;
  local_108[0x15] = 0;
  stack0xffffffffffffff50 = 0;
  uStack_ab = 0;
  uStack_a8._0_4_ = 0;
  uStack_a8._4_1_ = false;
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[0x10] = 0;
  local_108[0x11] = 0;
  local_108[0x12] = 0;
  local_108[0x13] = 0;
  local_120 = 3;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            ((cpp_dec_float<200U,_int,_void> *)local_118,&local_90,&local_120);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(this->fastDelta).m_backend,(cpp_dec_float<200U,_int,_void> *)local_118);
  return;
}

Assistant:

void SPxFastRT<R>::relax()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   minStab *= 0.95;
   fastDelta += 3 * delta_shift;
}